

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::CharSetInner::GetNextRange
          (CharSetInner *this,uint level,Char searchCharStart,Char *outLowerChar,Char *outHigherChar
          )

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  ushort local_3c;
  ushort local_3a;
  Char local_38;
  Char local_36;
  Char tempHigher;
  Char tempLower;
  Char currentHighChar;
  Char currentLowChar;
  uint innerIndex;
  Char *outHigherChar_local;
  Char *outLowerChar_local;
  Char searchCharStart_local;
  CharSetInner *pCStack_18;
  uint level_local;
  CharSetInner *this_local;
  
  _currentHighChar = outHigherChar;
  outHigherChar_local = outLowerChar;
  outLowerChar_local._2_2_ = searchCharStart;
  outLowerChar_local._4_4_ = level;
  pCStack_18 = this;
  uVar4 = CharSetNode::lim(level);
  if (uVar4 + 1 <= (uint)(ushort)searchCharStart) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x28e,"(searchCharStart < this->lim(level) + 1)",
                       "searchCharStart < this->lim(level) + 1");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar4 = outLowerChar_local._4_4_;
  outLowerChar_local._4_4_ = outLowerChar_local._4_4_ - 1;
  _tempHigher = CharSetNode::innerIdx(uVar4,(uint)(ushort)outLowerChar_local._2_2_);
  local_36 = L'\0';
  local_38 = L'\0';
  for (; uVar4 = outLowerChar_local._4_4_, _tempHigher < 0x10; _tempHigher = _tempHigher + 1) {
    if (this->children[_tempHigher] != (CharSetNode *)0x0) {
      pCVar1 = this->children[_tempHigher];
      uVar5 = CharSetNode::remain(outLowerChar_local._4_4_,(uint)(ushort)outLowerChar_local._2_2_);
      uVar6 = (*pCVar1->_vptr_CharSetNode[0xc])
                        (pCVar1,(ulong)uVar4,(ulong)(ushort)uVar5,&local_36,&local_38);
      if ((uVar6 & 1) != 0) break;
    }
    if (_tempHigher < 0xf) {
      uVar4 = CharSetNode::indexToValue(outLowerChar_local._4_4_ + 1,_tempHigher + 1,0);
      outLowerChar_local._2_2_ = (Char)uVar4;
    }
  }
  if (_tempHigher == 0x10) {
    this_local._7_1_ = false;
  }
  else {
    uVar4 = CharSetNode::indexToValue
                      (outLowerChar_local._4_4_ + 1,_tempHigher,(uint)(ushort)local_36);
    local_36 = (Char)uVar4;
    uVar4 = CharSetNode::indexToValue
                      (outLowerChar_local._4_4_ + 1,_tempHigher,(uint)(ushort)local_38);
    local_38 = (Char)uVar4;
    while( true ) {
      _tempHigher = _tempHigher + 1;
      uVar4 = CharSetNode::remain(outLowerChar_local._4_4_,(uint)(ushort)local_38);
      uVar5 = CharSetNode::lim(outLowerChar_local._4_4_);
      if ((((uVar4 != uVar5 || 0xf < _tempHigher) ||
           (this->children[_tempHigher] == (CharSetNode *)0x0)) ||
          (uVar6 = (*this->children[_tempHigher]->_vptr_CharSetNode[0xc])
                             (this->children[_tempHigher],(ulong)outLowerChar_local._4_4_,0,
                              &local_3a,&local_3c), (uVar6 & 1) == 0)) ||
         (uVar4 = CharSetNode::remain(outLowerChar_local._4_4_,(uint)local_3a), uVar4 != 0)) break;
      uVar4 = CharSetNode::indexToValue(outLowerChar_local._4_4_ + 1,_tempHigher,(uint)local_3c);
      local_38 = (Char)uVar4;
    }
    *outHigherChar_local = local_36;
    *_currentHighChar = local_38;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CharSetInner::GetNextRange(uint level, Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar) const
    {
        Assert(searchCharStart < this->lim(level) + 1);
        uint innerIndex = innerIdx(level--, searchCharStart);

        Char currentLowChar = 0, currentHighChar = 0;

        for (; innerIndex < branchingPerInnerLevel; innerIndex++)
        {
            if (children[innerIndex] != nullptr && children[innerIndex]->GetNextRange(level, (Char)remain(level, searchCharStart), &currentLowChar, &currentHighChar))
            {
                break;
            }

            if (innerIndex < branchingPerInnerLevel - 1)
            {
                searchCharStart = (Char)indexToValue(level + 1, innerIndex + 1, 0);
            }
        }

        if (innerIndex == branchingPerInnerLevel)
        {
            return false;
        }

        currentLowChar = (Char)indexToValue(level + 1, innerIndex, currentLowChar);
        currentHighChar = (Char)indexToValue(level + 1, innerIndex, currentHighChar);

        innerIndex += 1;

        for (; remain(level, currentHighChar) == lim(level) && innerIndex < branchingPerInnerLevel; innerIndex++)
        {
            Char tempLower, tempHigher;
            if (children[innerIndex] == nullptr || !children[innerIndex]->GetNextRange(level, 0x0, &tempLower, &tempHigher) || remain(level, tempLower) != 0)
            {
                break;
            }

            currentHighChar = (Char)indexToValue(level + 1, innerIndex, tempHigher);
        }

        *outLowerChar = currentLowChar;
        *outHigherChar = currentHighChar;

        return true;
    }